

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

QByteArrayView __thiscall
QIODevice::readLineInto(QIODevice *this,QSpan<std::byte,_18446744073709551615UL> buffer)

{
  uint uVar1;
  QIODevicePrivate *this_00;
  int iVar2;
  byte *pbVar3;
  ulong maxSize;
  char *what;
  byte *data;
  byte *pbVar4;
  QByteArrayView QVar5;
  
  maxSize = buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_size;
  data = buffer.super_QSpanBase<std::byte,_18446744073709551615UL>.m_data;
  this_00 = (QIODevicePrivate *)(this->super_QObject).d_ptr.d;
  uVar1 = (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
          super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  if ((uVar1 & 1) == 0) {
    if (uVar1 == 0) {
      what = "device not open";
    }
    else {
      what = "WriteOnly device";
    }
LAB_00244877:
    checkWarnMessage(this,"readLineInto",what);
    data = (byte *)0x0;
  }
  else {
    iVar2 = (*(this->super_QObject)._vptr_QObject[0x12])(this);
    if ((char)iVar2 == '\0') {
      if (0 < (long)maxSize) {
        if (0x7fffffffffffffec < maxSize) {
          checkWarnMessage(this,"readLineInto","maxSize argument exceeds QByteArray size limit");
        }
        pbVar3 = (byte *)QIODevicePrivate::readLine(this_00,(char *)data,maxSize,NotNullTerminated);
        if ((long)pbVar3 < 0) {
          data = (byte *)0x0;
        }
        pbVar4 = (byte *)0x0;
        if (0 < (long)pbVar3) {
          pbVar4 = pbVar3;
        }
        goto LAB_0024483a;
      }
      what = "Called with maxSize < 1";
      goto LAB_00244877;
    }
  }
  pbVar4 = (byte *)0x0;
LAB_0024483a:
  QVar5.m_data = (storage_type *)data;
  QVar5.m_size = (qsizetype)pbVar4;
  return QVar5;
}

Assistant:

QByteArrayView QIODevice::readLineInto(QSpan<std::byte> buffer)
{
    Q_D(QIODevice);
    qint64 maxSize = buffer.size();
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::readLineInto(%lld), d->pos = %lld, d->buffer.size() = %lld\n",
           this, qlonglong(maxSize), qlonglong(d->pos), qlonglong(d->buffer.size()));
#endif

    CHECK_READABLE(readLineInto, {});

    if (atEnd())
        return buffer.first(0);

    CHECK_LINEMAXLEN_1(readLineInto, {});
    CHECK_MAXBYTEARRAYSIZE(readLineInto);

    const qint64 readBytes = d->readLine(reinterpret_cast<char*>(buffer.data()), buffer.size(),
                                         QIODevicePrivate::ReadLineOption::NotNullTerminated);

    if (readBytes < 0)
        return {};

    return buffer.first(readBytes);
}